

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

void Fra_ClauMinimizeClause(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  iVar2 = vExtra->nSize;
  if (0 < (long)iVar2) {
    lVar6 = (ulong)(iVar2 - 1) + 1;
    lVar5 = (long)iVar2;
    do {
      if (vExtra->nSize < lVar5) {
LAB_005c5a00:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      vBasis->nSize = 0;
      if (0 < vExtra->nSize) {
        lVar7 = 0;
        do {
          if (lVar5 + -1 != lVar7) {
            Vec_IntPush(vBasis,vExtra->pArray[lVar7]);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < vExtra->nSize);
      }
      iVar2 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar2 != 0) {
        uVar3 = (ulong)vExtra->nSize;
        lVar7 = lVar6;
        if (lVar5 < (long)uVar3) {
          do {
            iVar4 = (int)lVar7;
            if ((int)uVar3 <= iVar4) goto LAB_005c5a00;
            vExtra->pArray[lVar7 + -1] = vExtra->pArray[lVar7];
            uVar3 = (ulong)(uint)vExtra->nSize;
            iVar2 = vExtra->nSize - 1;
            lVar7 = lVar7 + 1;
          } while (iVar4 < iVar2);
        }
        else {
          iVar2 = vExtra->nSize + -1;
        }
        vExtra->nSize = iVar2;
      }
      lVar6 = lVar6 + -1;
      bVar1 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    int iLit, iLit2, i, k;
    Vec_IntForEachEntryReverse( vExtra, iLit, i )
    {
        // copy literals without the given one
        Vec_IntClear( vBasis );
        Vec_IntForEachEntry( vExtra, iLit2, k )
            if ( k != i )
                Vec_IntPush( vBasis, iLit2 );
        // try whether it is inductive
        if ( !Fra_ClauCheckClause( p, vBasis, NULL ) )
            continue;
        // the clause is inductive
        // remove the literal
        for ( k = i; k < Vec_IntSize(vExtra)-1; k++ )
            Vec_IntWriteEntry( vExtra, k, Vec_IntEntry(vExtra,k+1) );
        Vec_IntShrink( vExtra, Vec_IntSize(vExtra)-1 );
    }
}